

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.hpp
# Opt level: O0

void __thiscall
mio::basic_mmap<(mio::access_mode)0,_char>::basic_mmap
          (basic_mmap<(mio::access_mode)0,_char> *this,basic_mmap<(mio::access_mode)0,_char> *other)

{
  basic_mmap<(mio::access_mode)0,_char> *other_local;
  basic_mmap<(mio::access_mode)0,_char> *this_local;
  
  this->data_ = other->data_;
  this->length_ = other->length_;
  this->mapped_length_ = other->mapped_length_;
  this->file_handle_ = other->file_handle_;
  this->is_handle_internal_ = (bool)(other->is_handle_internal_ & 1);
  other->data_ = (pointer)0x0;
  other->mapped_length_ = 0;
  other->length_ = 0;
  other->file_handle_ = -1;
  return;
}

Assistant:

basic_mmap<AccessMode, ByteT>::basic_mmap(basic_mmap&& other)
    : data_(std::move(other.data_))
    , length_(std::move(other.length_))
    , mapped_length_(std::move(other.mapped_length_))
    , file_handle_(std::move(other.file_handle_))
#ifdef _WIN32
    , file_mapping_handle_(std::move(other.file_mapping_handle_))
#endif
    , is_handle_internal_(std::move(other.is_handle_internal_))
{
    other.data_ = nullptr;
    other.length_ = other.mapped_length_ = 0;
    other.file_handle_ = invalid_handle;
#ifdef _WIN32
    other.file_mapping_handle_ = invalid_handle;
#endif
}